

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void rbuIndexCntFunc(sqlite3_context *pCtx,int nVal,sqlite3_value **apVal)

{
  void *pvVar1;
  sqlite3 *db;
  sqlite3_stmt *pStmt_00;
  int iVar2;
  int iVal;
  uchar *puVar3;
  char *pcVar4;
  char *zErrmsg;
  sqlite3_stmt *pStmt;
  
  pvVar1 = pCtx->pFunc->pUserData;
  pStmt = (sqlite3_stmt *)0x0;
  zErrmsg = (char *)0x0;
  db = *(sqlite3 **)((long)pvVar1 + 8);
  puVar3 = sqlite3_value_text(*apVal);
  iVal = 0;
  pcVar4 = sqlite3_mprintf("SELECT count(*) FROM sqlite_master WHERE type=\'index\' AND tbl_name = %Q"
                           ,puVar3);
  iVar2 = prepareFreeAndCollectError(db,&pStmt,&zErrmsg,pcVar4);
  pStmt_00 = pStmt;
  pcVar4 = zErrmsg;
  if (iVar2 == 0) {
    iVar2 = sqlite3_step(pStmt);
    if (iVar2 == 100) {
      iVal = sqlite3_column_int(pStmt_00,0);
    }
    iVar2 = sqlite3_finalize(pStmt_00);
    if (iVar2 == 0) {
      sqlite3_result_int(pCtx,iVal);
      goto LAB_001b8307;
    }
    pcVar4 = sqlite3_errmsg(*(sqlite3 **)((long)pvVar1 + 8));
  }
  sqlite3_result_error(pCtx,pcVar4,-1);
LAB_001b8307:
  sqlite3_free(zErrmsg);
  return;
}

Assistant:

static void rbuIndexCntFunc(
  sqlite3_context *pCtx, 
  int nVal,
  sqlite3_value **apVal
){
  sqlite3rbu *p = (sqlite3rbu*)sqlite3_user_data(pCtx);
  sqlite3_stmt *pStmt = 0;
  char *zErrmsg = 0;
  int rc;

  assert( nVal==1 );
  
  rc = prepareFreeAndCollectError(p->dbMain, &pStmt, &zErrmsg, 
      sqlite3_mprintf("SELECT count(*) FROM sqlite_master "
        "WHERE type='index' AND tbl_name = %Q", sqlite3_value_text(apVal[0]))
  );
  if( rc!=SQLITE_OK ){
    sqlite3_result_error(pCtx, zErrmsg, -1);
  }else{
    int nIndex = 0;
    if( SQLITE_ROW==sqlite3_step(pStmt) ){
      nIndex = sqlite3_column_int(pStmt, 0);
    }
    rc = sqlite3_finalize(pStmt);
    if( rc==SQLITE_OK ){
      sqlite3_result_int(pCtx, nIndex);
    }else{
      sqlite3_result_error(pCtx, sqlite3_errmsg(p->dbMain), -1);
    }
  }

  sqlite3_free(zErrmsg);
}